

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O1

void __thiscall thread_pool::thread_pool(thread_pool *this,size_t n)

{
  unique_lock<std::mutex> lock;
  thread local_60;
  unique_lock<std::mutex> local_58;
  condition_variable *local_48;
  condition_variable *local_40;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  
  (this->m_running)._M_base._M_i = true;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&this->m_threads,n,(allocator_type *)&local_58);
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_40 = &this->m_cv;
  std::condition_variable::condition_variable(local_40);
  local_48 = &this->m_cvWait;
  std::condition_variable::condition_variable(local_48);
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_work).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&this->m_work,0);
  local_58._M_device = &this->m_mutex;
  this->m_doingWork = 0;
  local_58._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_58);
  local_58._M_owns = true;
  if (n != 0) {
    do {
      local_38.this = this;
      std::thread::thread<thread_pool::thread_pool(unsigned_long)::_lambda()_1_,,void>
                (&local_60,&local_38);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->m_threads,&local_60);
      if (local_60._M_id._M_thread != 0) {
        std::terminate();
      }
      n = n - 1;
    } while (n != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  return;
}

Assistant:

thread_pool(const size_t n)
    : m_running(true)
    , m_threads(n)
    , m_doingWork(0)
  {
    std::unique_lock<std::mutex> lock(m_mutex);
    for (size_t i=0; i<n; ++i)
      m_threads.push_back(std::move(std::thread([this]{ worker(); })));
  }